

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context_file_opener.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>,_true>
duckdb::FileOpener::TryGetCatalogTransaction(optional_ptr<duckdb::FileOpener,_true> opener)

{
  int iVar1;
  FileOpener *pFVar2;
  undefined4 extraout_var;
  ClientContext *context_00;
  undefined4 extraout_var_00;
  DatabaseInstance *db_00;
  long in_RSI;
  unique_ptr<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_> in_RDI;
  optional_ptr<duckdb::DatabaseInstance,_true> db;
  optional_ptr<duckdb::ClientContext,_true> context;
  optional_ptr<duckdb::FileOpener,_true> local_50;
  optional_ptr<duckdb::DatabaseInstance,_true> local_48;
  optional_ptr<duckdb::ClientContext,_true> local_40;
  CatalogTransaction local_38;
  
  if (in_RSI == 0) {
LAB_0043ab99:
    *(undefined8 *)
     in_RDI._M_t.
     super___uniq_ptr_impl<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_>
     ._M_t.
     super__Tuple_impl<0UL,_duckdb::CatalogTransaction_*,_std::default_delete<duckdb::CatalogTransaction>_>
     .super__Head_base<0UL,_duckdb::CatalogTransaction_*,_false>._M_head_impl = 0;
  }
  else {
    pFVar2 = optional_ptr<duckdb::FileOpener,_true>::operator->(&local_50);
    iVar1 = (*pFVar2->_vptr_FileOpener[4])(pFVar2);
    local_40.ptr = (ClientContext *)CONCAT44(extraout_var,iVar1);
    if (local_40.ptr == (ClientContext *)0x0) {
      pFVar2 = optional_ptr<duckdb::FileOpener,_true>::operator->(&local_50);
      iVar1 = (*pFVar2->_vptr_FileOpener[5])(pFVar2);
      local_48.ptr = (DatabaseInstance *)CONCAT44(extraout_var_00,iVar1);
      if (local_48.ptr == (DatabaseInstance *)0x0) goto LAB_0043ab99;
      db_00 = optional_ptr<duckdb::DatabaseInstance,_true>::operator*(&local_48);
      CatalogTransaction::GetSystemTransaction(&local_38,db_00);
    }
    else {
      context_00 = optional_ptr<duckdb::ClientContext,_true>::operator*(&local_40);
      CatalogTransaction::GetSystemCatalogTransaction(&local_38,context_00);
    }
    make_uniq<duckdb::CatalogTransaction,duckdb::CatalogTransaction>
              ((duckdb *)
               in_RDI._M_t.
               super___uniq_ptr_impl<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::CatalogTransaction_*,_std::default_delete<duckdb::CatalogTransaction>_>
               .super__Head_base<0UL,_duckdb::CatalogTransaction_*,_false>._M_head_impl,&local_38);
  }
  return (unique_ptr<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_>)
         (__uniq_ptr_impl<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_>
          )in_RDI._M_t.
           super___uniq_ptr_impl<duckdb::CatalogTransaction,_std::default_delete<duckdb::CatalogTransaction>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CatalogTransaction_*,_std::default_delete<duckdb::CatalogTransaction>_>
           .super__Head_base<0UL,_duckdb::CatalogTransaction_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CatalogTransaction> FileOpener::TryGetCatalogTransaction(optional_ptr<FileOpener> opener) {
	if (!opener) {
		return nullptr;
	}
	auto context = opener->TryGetClientContext();
	if (context) {
		return make_uniq<CatalogTransaction>(CatalogTransaction::GetSystemCatalogTransaction(*context));
	}

	auto db = opener->TryGetDatabase();
	if (db) {
		return make_uniq<CatalogTransaction>(CatalogTransaction::GetSystemTransaction(*db));
	}
	return nullptr;
}